

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

CborError jsonObjectToCbor(CborEncoder *parent,QJsonObject *o)

{
  qsizetype *pqVar1;
  QCborContainerPrivate *this;
  QCborContainerPrivate *pQVar2;
  qsizetype qVar3;
  CborDevice *pCVar4;
  CborError CVar5;
  qsizetype qVar6;
  size_t length;
  ulong uVar7;
  byte bVar8;
  QCborContainerPrivate *pQVar9;
  char *pcVar10;
  QCborContainerPrivate *pQVar11;
  long lVar12;
  undefined1 *puVar13;
  long in_FS_OFFSET;
  char cVar14;
  QJsonValueConstRef self;
  QJsonValueConstRef self_00;
  QByteArray local_98;
  anon_union_8_3_8ebc2b8a_for_data local_78;
  CborDevice *pCStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = (o->o).d.ptr;
  qVar6 = QJsonObject::size(o);
  pQVar2 = (o->o).d.ptr;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pCStack_70 = (CborDevice *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar9 = pQVar2;
  length = QJsonObject::size(o);
  if (-2 < (long)length) {
    pQVar9 = (QCborContainerPrivate *)0xa0;
    create_container(parent,(CborEncoder *)&local_78,length,0xa0);
  }
  if (this != pQVar2 || qVar6 * 2 != 0) {
    pQVar11 = (QCborContainerPrivate *)0x1;
    do {
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      self._8_8_ = pQVar9;
      self.d = pQVar11;
      QJsonValueConstRef::objectKey(&local_58,(QJsonValueConstRef *)this,self);
      QString::toUtf8_helper(&local_98,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      pCVar4 = pCStack_70;
      qVar3 = local_98.d.size;
      pcVar10 = local_98.d.ptr;
      if (local_98.d.ptr == (char *)0x0) {
        pcVar10 = "";
      }
      if (local_68 != (undefined1 *)0x0) {
        local_68 = local_68 + -1;
      }
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      uVar7 = (ulong)local_98.d.size >> 0x38 | (local_98.d.size & 0xff000000000000U) >> 0x28 |
              (local_98.d.size & 0xff0000000000U) >> 0x18 | (local_98.d.size & 0xff00000000U) >> 8 |
              (local_98.d.size & 0xff000000U) << 8 | (local_98.d.size & 0xff0000U) << 0x18 |
              (local_98.d.size & 0xff00U) << 0x28;
      local_58.d.ptr = (char16_t *)(uVar7 | local_98.d.size << 0x38);
      if ((ulong)local_98.d.size < (undefined1 *)0x18) {
        local_58.d.ptr._7_1_ = (char)local_98.d.size;
        local_58.d.ptr = (char16_t *)CONCAT17(local_58.d.ptr._7_1_ + '`',(int7)uVar7);
        puVar13 = (undefined1 *)((long)&local_58.d.ptr + 7);
      }
      else {
        cVar14 = (undefined1 *)0xff < (ulong)local_98.d.size;
        if ((undefined1 *)0xffff < (ulong)local_98.d.size) {
          cVar14 = '\x02';
        }
        bVar8 = (cVar14 + '\x01') - ((ulong)local_98.d.size >> 0x20 == 0);
        lVar12 = -1L << (bVar8 & 0x3f);
        puVar13 = (undefined1 *)((long)&local_58.d.ptr + lVar12 + 7);
        pQVar9 = (QCborContainerPrivate *)((ulong)bVar8 | 0x78);
        *(char *)((long)&local_58.d.ptr + lVar12 + 7) = (char)pQVar9;
      }
      pqVar1 = &local_58.d.size;
      if (pqVar1 != (qsizetype *)puVar13) {
        lVar12 = 0;
        do {
          CborDevice::putByte(pCVar4,puVar13[lVar12]);
          lVar12 = lVar12 + 1;
        } while ((long)pqVar1 - (long)puVar13 != lVar12);
      }
      pCVar4 = pCStack_70;
      if ((undefined1 *)qVar3 != (undefined1 *)0x0) {
        puVar13 = (undefined1 *)0x0;
        do {
          CborDevice::putChar(pCVar4,pcVar10[(long)puVar13]);
          puVar13 = puVar13 + 1;
        } while ((undefined1 *)qVar3 != puVar13);
      }
      self_00._8_8_ = pQVar9;
      self_00.d = pQVar11;
      QJsonValueConstRef::concrete((QJsonValue *)&local_58,(QJsonValueConstRef *)this,self_00);
      jsonValueToCbor((CborEncoder *)&local_78,(QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar7 = (ulong)pQVar11 & 0xfffffffffffffffe;
      pQVar11 = (QCborContainerPrivate *)(((uint)pQVar11 & 1) + uVar7 + 2);
    } while ((this != pQVar2) || (uVar7 + 2 != qVar6 * 2));
  }
  parent->end = (uint8_t *)pCStack_70;
  (parent->data).ptr = (uint8_t *)local_78;
  if (((ulong)puStack_60 & 0x10) == 0) {
    if (local_68 == (undefined1 *)0x1) {
      CVar5 = (uint)(pCStack_70 == (CborDevice *)0x0) << 0x1f;
    }
    else {
      CVar5 = CborErrorTooFewItems - (uint)(local_68 == (undefined1 *)0x0);
    }
  }
  else {
    CborDevice::putByte(pCStack_70,0xff);
    CVar5 = CborNoError;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return CVar5;
  }
  __stack_chk_fail();
}

Assistant:

static CborError jsonObjectToCbor(CborEncoder *parent, const QJsonObject &o)
{
    auto it = o.constBegin();
    auto end = o.constEnd();
    CborEncoder map;
    cbor_encoder_create_map(parent, &map, o.size());

    for ( ; it != end; ++it) {
        QByteArray key = it.key().toUtf8();
        cbor_encode_text_string(&map, key.constData(), key.size());
        jsonValueToCbor(&map, it.value());
    }
    return cbor_encoder_close_container(parent, &map);
}